

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

GLchar * __thiscall
gl4cts::GPUShaderFP64Test3::getUniformLayoutName
          (GPUShaderFP64Test3 *this,uniformDataLayout uniform_data_layout)

{
  if (uniform_data_layout < (STD140|SHARED)) {
    return *(GLchar **)(&DAT_01dc4ea8 + (ulong)uniform_data_layout * 8);
  }
  return glcts::fixed_sample_locations_values + 1;
}

Assistant:

const glw::GLchar* GPUShaderFP64Test3::getUniformLayoutName(uniformDataLayout uniform_data_layout) const
{
	const glw::GLchar* layout = "";

	switch (uniform_data_layout)
	{
	case PACKED:
		layout = "packed";
		break;
	case SHARED:
		layout = "shared";
		break;
	case STD140:
		layout = "std140";
		break;
	}

	return layout;
}